

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.cpp
# Opt level: O2

bool __thiscall VMStack::destroyTopFrame(VMStack *this)

{
  Frame *this_00;
  size_type sVar1;
  _Elt_pointer ppFVar2;
  
  sVar1 = std::deque<Frame_*,_std::allocator<Frame_*>_>::size
                    ((deque<Frame_*,_std::allocator<Frame_*>_> *)this);
  if (sVar1 != 0) {
    ppFVar2 = (this->_frameStack).c.super__Deque_base<Frame_*,_std::allocator<Frame_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppFVar2 ==
        (this->_frameStack).c.super__Deque_base<Frame_*,_std::allocator<Frame_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppFVar2 = (this->_frameStack).c.super__Deque_base<Frame_*,_std::allocator<Frame_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this_00 = ppFVar2[-1];
    std::deque<Frame_*,_std::allocator<Frame_*>_>::pop_back
              ((deque<Frame_*,_std::allocator<Frame_*>_> *)this);
    if (this_00 != (Frame *)0x0) {
      Frame::~Frame(this_00);
    }
    operator_delete(this_00);
  }
  return sVar1 != 0;
}

Assistant:

bool VMStack::destroyTopFrame() {
    if (_frameStack.size() == 0) {
        return false;
    }
    
    Frame *frame = _frameStack.top();
    _frameStack.pop();
    delete frame;
    
    return true;
}